

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::BufferAccessHandler::handle
          (BufferAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  size_t *psVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  Compiler *this_00;
  SmallVector<spirv_cross::BufferRange,_8UL> *this_01;
  BufferRange *pBVar4;
  size_t sVar5;
  bool bVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  SPIRConstant *pSVar10;
  SPIRType *type;
  size_t sVar11;
  ulong uVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  uint32_t index;
  __node_gen_type __node_gen;
  uint local_34;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_30;
  
  if (opcode - OpArrayLength < 0xfffffffd) {
    bVar6 = true;
  }
  else {
    uVar7 = opcode == OpPtrAccessChain | 4;
    bVar6 = uVar7 <= length;
    if (uVar7 <= length) {
      if (args[2] == this->id) {
        pSVar10 = Variant::get<spirv_cross::SPIRConstant>
                            ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                             args[(ulong)(opcode == OpPtrAccessChain) + 3]);
        local_34 = (pSVar10->m).c[0].r[0].u32;
        uVar2 = (this->seen)._M_h._M_bucket_count;
        uVar12 = (ulong)local_34 % uVar2;
        p_Var13 = (this->seen)._M_h._M_buckets[uVar12];
        p_Var14 = (__node_base_ptr)0x0;
        if ((p_Var13 != (__node_base_ptr)0x0) &&
           (p_Var3 = p_Var13->_M_nxt, p_Var14 = p_Var13,
           local_34 != *(uint *)&p_Var13->_M_nxt[1]._M_nxt)) {
          while (p_Var13 = p_Var3, p_Var3 = p_Var13->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
            p_Var14 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar12) ||
               (p_Var14 = p_Var13, local_34 == *(uint *)&p_Var3[1]._M_nxt)) goto LAB_00337f58;
          }
          p_Var14 = (__node_base_ptr)0x0;
        }
LAB_00337f58:
        if ((p_Var14 == (__node_base_ptr)0x0) || (p_Var14->_M_nxt == (_Hash_node_base *)0x0)) {
          local_30 = &this->seen;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_30,&local_34);
          this_00 = this->compiler;
          uVar8 = expression_type_id(this_00,this->id);
          type = Variant::get<spirv_cross::SPIRType>
                           ((this_00->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar8);
          uVar8 = type_struct_member_offset(this->compiler,type,local_34);
          if ((ulong)(local_34 + 1) <
              (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size) {
            uVar9 = type_struct_member_offset(this->compiler,type,local_34 + 1);
            sVar11 = (size_t)(uVar9 - uVar8);
          }
          else {
            sVar11 = get_declared_struct_member_size(this->compiler,type,local_34);
          }
          uVar7 = local_34;
          this_01 = this->ranges;
          SmallVector<spirv_cross::BufferRange,_8UL>::reserve
                    (this_01,(this_01->super_VectorView<spirv_cross::BufferRange>).buffer_size + 1);
          pBVar4 = (this_01->super_VectorView<spirv_cross::BufferRange>).ptr;
          sVar5 = (this_01->super_VectorView<spirv_cross::BufferRange>).buffer_size;
          pBVar4[sVar5].index = uVar7;
          pBVar4[sVar5].offset = (ulong)uVar8;
          pBVar4[sVar5].range = sVar11;
          psVar1 = &(this_01->super_VectorView<spirv_cross::BufferRange>).buffer_size;
          *psVar1 = *psVar1 + 1;
        }
      }
      return true;
    }
  }
  return bVar6;
}

Assistant:

bool Compiler::BufferAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	if (opcode != OpAccessChain && opcode != OpInBoundsAccessChain && opcode != OpPtrAccessChain)
		return true;

	bool ptr_chain = (opcode == OpPtrAccessChain);

	// Invalid SPIR-V.
	if (length < (ptr_chain ? 5u : 4u))
		return false;

	if (args[2] != id)
		return true;

	// Don't bother traversing the entire access chain tree yet.
	// If we access a struct member, assume we access the entire member.
	uint32_t index = compiler.get<SPIRConstant>(args[ptr_chain ? 4 : 3]).scalar();

	// Seen this index already.
	if (seen.find(index) != end(seen))
		return true;
	seen.insert(index);

	auto &type = compiler.expression_type(id);
	uint32_t offset = compiler.type_struct_member_offset(type, index);

	size_t range;
	// If we have another member in the struct, deduce the range by looking at the next member.
	// This is okay since structs in SPIR-V can have padding, but Offset decoration must be
	// monotonically increasing.
	// Of course, this doesn't take into account if the SPIR-V for some reason decided to add
	// very large amounts of padding, but that's not really a big deal.
	if (index + 1 < type.member_types.size())
	{
		range = compiler.type_struct_member_offset(type, index + 1) - offset;
	}
	else
	{
		// No padding, so just deduce it from the size of the member directly.
		range = compiler.get_declared_struct_member_size(type, index);
	}

	ranges.push_back({ index, offset, range });
	return true;
}